

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::end__ci(FormulasLoader *this)

{
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *this_00;
  value_type *in_RDI;
  VariableExpression *variable;
  String *in_stack_ffffffffffffffd8;
  VariableExpression *in_stack_ffffffffffffffe0;
  
  this_00 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
            operator_new(0x30);
  MathML::AST::VariableExpression::VariableExpression
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::clear();
  std::
  stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
  ::top((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
         *)0xb27c60);
  std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::push_back
            (this_00,in_RDI);
  return true;
}

Assistant:

bool FormulasLoader::end__ci()
	{
		MathML::AST::VariableExpression* variable = FW_NEW MathML::AST::VariableExpression( mCurrentTextData );
		mCurrentTextData.clear();
		mNodeListStack.top().push_back( variable );

		return true;
	}